

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  char cVar1;
  size_t in_length;
  mmap *pmVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  _Rb_tree_node_base *p_Var7;
  undefined7 in_register_00000009;
  size_type *psVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  string *psVar13;
  pointer pMVar14;
  ulong uVar15;
  ulong uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pMVar17;
  bool bVar18;
  string sub_path;
  shared_ptr<httplib::detail::mmap> mm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  uint local_1b8;
  undefined1 local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  mmap *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  undefined4 local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Server *local_158;
  Response *local_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  _Any_data *local_120;
  Request *local_118;
  string *local_110;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_108;
  string *local_100;
  pointer local_f8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  stat local_c0;
  
  local_17c = (undefined4)CONCAT71(in_register_00000009,head);
  pMVar14 = (this->base_dirs_).
            super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar17 = (this->base_dirs_).
            super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar14 != pMVar17) {
    psVar13 = &req->path;
    local_f0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers;
    local_108 = &this->file_extension_and_mimetype_map_;
    local_110 = &this->default_file_mimetype_;
    local_120 = (_Any_data *)&this->file_request_handler_;
    local_1b8 = (uint)local_120;
    local_158 = this;
    local_150 = res;
    local_118 = req;
    local_100 = psVar13;
    local_f8 = pMVar17;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((ulong)psVar13,0,(string *)(pMVar14->mount_point)._M_string_length);
      if (iVar4 == 0) {
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)psVar13);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x195a32);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1b0.field_2._M_allocated_capacity = *psVar8;
          local_1b0.field_2._8_8_ = plVar5[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar8;
          local_1b0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1b0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
          operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
        }
        if (local_1b0._M_string_length == 0) {
          uVar12 = 0;
LAB_00140c5d:
          if (uVar12 < local_1b0._M_string_length) {
            lVar11 = 0;
            do {
              uVar9 = uVar12 + 1;
              uVar15 = uVar12;
              if (uVar12 + 1 < local_1b0._M_string_length) {
                uVar9 = local_1b0._M_string_length;
              }
              do {
                uVar16 = uVar15;
                if (local_1b0._M_dataplus._M_p[uVar15] == '/') break;
                uVar15 = uVar15 + 1;
                uVar16 = uVar9;
              } while (uVar9 != uVar15);
              iVar4 = std::__cxx11::string::compare
                                ((ulong)&local_1b0,uVar12,(char *)(uVar16 - uVar12));
              if (iVar4 != 0) {
                iVar4 = std::__cxx11::string::compare
                                  ((ulong)&local_1b0,uVar12,(char *)(uVar16 - uVar12));
                if (iVar4 == 0) {
                  if (lVar11 == 0) {
                    bVar10 = true;
                    goto LAB_00140ff5;
                  }
                  lVar11 = lVar11 + -1;
                }
                else {
                  lVar11 = lVar11 + 1;
                }
              }
              if (uVar16 < local_1b0._M_string_length) {
                while (local_1b0._M_dataplus._M_p[uVar16] == '/') {
                  uVar16 = uVar16 + 1;
                  if (local_1b0._M_string_length == uVar16) goto LAB_00140d07;
                }
              }
              uVar12 = uVar16;
            } while (uVar16 < local_1b0._M_string_length);
          }
        }
        else {
          uVar12 = 0;
          do {
            if (local_1b0._M_dataplus._M_p[uVar12] != '/') goto LAB_00140c5d;
            uVar12 = uVar12 + 1;
          } while (local_1b0._M_string_length != uVar12);
        }
LAB_00140d07:
        std::operator+(&local_178,&pMVar14->base_dir,&local_1b0);
        if (local_178._M_dataplus._M_p[local_178._M_string_length - 1] == '/') {
          std::__cxx11::string::append((char *)&local_178);
        }
        iVar4 = stat(local_178._M_dataplus._M_p,&local_c0);
        bVar18 = (local_c0.st_mode & 0xf000) != 0x8000;
        bVar10 = bVar18 || iVar4 < 0;
        if (!bVar18 && iVar4 >= 0) {
          for (p_Var7 = (pMVar14->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &(pMVar14->headers)._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,*(char **)(p_Var7 + 1),(allocator<char> *)&local_190);
            cVar1 = *(char *)local_c0.st_dev;
            pcVar6 = (char *)local_c0.st_dev;
            while (cVar1 != '\0') {
              pcVar6 = pcVar6 + 1;
              if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_00140dfb;
              cVar1 = *pcVar6;
            }
            pcVar6 = *(char **)(p_Var7 + 2);
            cVar1 = *pcVar6;
            while (cVar1 != '\0') {
              pcVar6 = pcVar6 + 1;
              if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_00140dfb;
              cVar1 = *pcVar6;
            }
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      (local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 2));
LAB_00140dfb:
            if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
              operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
            }
          }
          local_190 = (mmap *)0x0;
          local_c0.st_dev = (__dev_t)local_178._M_dataplus._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<httplib::detail::mmap,std::allocator<httplib::detail::mmap>,char_const*>
                    (&local_188,&local_190,(allocator<httplib::detail::mmap> *)&local_1b1,
                     (char **)&local_c0);
          bVar18 = local_190->addr_ != (void *)0x0;
          local_1b8 = (uint)bVar18;
          if (bVar18) {
            in_length = local_190->size_;
            detail::find_content_type((string *)&local_c0,&local_178,local_108,local_110);
            _Var3._M_pi = local_188._M_pi;
            pmVar2 = local_190;
            if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
              }
            }
            local_138 = (code *)0x0;
            pcStack_130 = (code *)0x0;
            local_148._M_unused._M_object = (void *)0x0;
            local_148._8_8_ = 0;
            local_148._M_unused._M_object = operator_new(0x10);
            *(mmap **)local_148._M_unused._0_8_ = pmVar2;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_148._M_unused._0_8_ + 8)
                 = _Var3._M_pi;
            pcStack_130 = std::
                          _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:6095:15)>
                          ::_M_invoke;
            local_138 = std::
                        _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:6095:15)>
                        ::_M_manager;
            local_e8._M_unused._M_object = (void *)0x0;
            local_e8._8_8_ = 0;
            local_d8 = (code *)0x0;
            uStack_d0 = 0;
            Response::set_content_provider
                      (local_150,in_length,(string *)&local_c0,(ContentProvider *)&local_148,
                       (ContentProviderResourceReleaser *)&local_e8);
            if (local_d8 != (code *)0x0) {
              (*local_d8)(&local_e8,&local_e8,__destroy_functor);
            }
            if (local_138 != (code *)0x0) {
              (*local_138)(&local_148,&local_148,__destroy_functor);
            }
            if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
              operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
            }
            if (((char)local_17c == '\0') &&
               ((local_158->file_request_handler_).super__Function_base._M_manager !=
                (_Manager_type)0x0)) {
              (*(local_158->file_request_handler_)._M_invoker)(local_120,local_118,local_150);
            }
          }
          if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
LAB_00140ff5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        psVar13 = local_100;
        pMVar17 = local_f8;
        if (!bVar10) goto LAB_00141041;
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != pMVar17);
  }
  local_1b8._0_1_ = 0;
LAB_00141041:
  return (bool)((byte)local_1b8 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        if (detail::is_file(path)) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first.c_str(), kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}